

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Object_State_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Point_Object_State_PDU::Encode(Point_Object_State_PDU *this,KDataStream *stream)

{
  Object_State_Header::Encode(&this->super_Object_State_Header,stream);
  KDataStream::Write(stream,(this->super_Object_State_Header).field_0x4b);
  (*(this->m_ObjTyp).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_ObjTyp,stream);
  (*(this->m_Loc).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Loc,stream);
  (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Ori,stream);
  (*(this->m_Apperance).super_ObjectAppearance.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_Apperance,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding);
  (*(this->m_ReqID).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_ReqID,stream);
  (*(this->m_RecvID).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_RecvID,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32Padding1);
  return;
}

Assistant:

void Point_Object_State_PDU::Encode( KDataStream & stream ) const
{
    Object_State_Header::Encode( stream );

    stream << m_ModificationUnion.m_ui8Modifications
           << KDIS_STREAM m_ObjTyp
           << KDIS_STREAM m_Loc
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_Apperance
           << m_ui16Padding
           << KDIS_STREAM m_ReqID
           << KDIS_STREAM m_RecvID
           << m_ui32Padding1;
}